

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O1

unsigned_long __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::PushElement<unsigned_int,unsigned_long>
          (FlatBufferBuilderImpl<true> *this,uint element)

{
  uint8_t *puVar1;
  unsigned_long uVar2;
  
  if (this->minalign_ < 4) {
    this->minalign_ = 4;
  }
  vector_downward<unsigned_long>::fill(&this->buf_,(ulong)(-(int)(this->buf_).size_ & 3));
  vector_downward<unsigned_long>::ensure_space(&this->buf_,4);
  puVar1 = (this->buf_).cur_;
  (this->buf_).cur_ = puVar1 + -4;
  uVar2 = (this->buf_).size_ + 4;
  (this->buf_).size_ = uVar2;
  *(uint *)(puVar1 + -4) = element;
  this->length_of_64_bit_region_ = uVar2;
  return uVar2;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }